

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O0

Bond_p __thiscall indigox::Molecule::GetBond(Molecule *this,Atom_p *a,Atom_p *b)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  element_type *peVar4;
  uid_t uVar5;
  uid_t uVar6;
  AtomBondIterator this_00;
  AtomBondIterator __a;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CountableObject<indigox::Molecule> *in_RSI;
  element_type *in_RDI;
  Bond_p BVar7;
  AtomBondIterator it;
  Bond_p bnd;
  Bond_p *tmp;
  undefined4 in_stack_fffffffffffffed8;
  byte in_stack_fffffffffffffedc;
  byte in_stack_fffffffffffffedd;
  byte in_stack_fffffffffffffede;
  byte in_stack_fffffffffffffedf;
  shared_ptr<indigox::Bond> *in_stack_fffffffffffffee0;
  Atom *in_stack_fffffffffffffee8;
  __normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
  local_68 [3];
  int local_50;
  
  std::shared_ptr<indigox::Bond>::shared_ptr((shared_ptr<indigox::Bond> *)0x10fd48);
  std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x10fd52);
  Atom::GetMolecule(in_stack_fffffffffffffee8);
  peVar4 = std::__shared_ptr_access<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x10fd71);
  uVar5 = utils::CountableObject<indigox::Molecule>::GetUniqueID
                    (&peVar4->super_CountableObject<indigox::Molecule>);
  uVar6 = utils::CountableObject<indigox::Molecule>::GetUniqueID(in_RSI);
  std::shared_ptr<indigox::Molecule>::~shared_ptr((shared_ptr<indigox::Molecule> *)0x10fd9e);
  if (uVar5 == uVar6) {
    std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x10fe18);
    Atom::GetMolecule(in_stack_fffffffffffffee8);
    peVar4 = std::__shared_ptr_access<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x10fe37);
    uVar5 = utils::CountableObject<indigox::Molecule>::GetUniqueID
                      (&peVar4->super_CountableObject<indigox::Molecule>);
    uVar6 = utils::CountableObject<indigox::Molecule>::GetUniqueID(in_RSI);
    std::shared_ptr<indigox::Molecule>::~shared_ptr((shared_ptr<indigox::Molecule> *)0x10fe64);
    if (uVar5 == uVar6) {
      std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x10fec5);
      this_00 = Atom::BeginBond((Atom *)CONCAT17(in_stack_fffffffffffffedf,
                                                 CONCAT16(in_stack_fffffffffffffede,
                                                          CONCAT15(in_stack_fffffffffffffedd,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffffedc,
                                                  in_stack_fffffffffffffed8)))));
      local_68[0]._M_current = (weak_ptr<indigox::Bond> *)this_00;
      while( true ) {
        std::__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::Atom,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x10feeb);
        __a = Atom::EndBond((Atom *)CONCAT17(in_stack_fffffffffffffedf,
                                             CONCAT16(in_stack_fffffffffffffede,
                                                      CONCAT15(in_stack_fffffffffffffedd,
                                                               CONCAT14(in_stack_fffffffffffffedc,
                                                                        in_stack_fffffffffffffed8)))
                                            ));
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
                            *)__a._M_current,
                           (__normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffedf,
                                       CONCAT16(in_stack_fffffffffffffede,
                                                CONCAT15(in_stack_fffffffffffffedd,
                                                         CONCAT14(in_stack_fffffffffffffedc,
                                                                  in_stack_fffffffffffffed8)))));
        if (!bVar1) break;
        bVar1 = false;
        __gnu_cxx::
        __normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
        ::operator->(local_68);
        std::weak_ptr<indigox::Bond>::lock(this_00._M_current);
        std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x10ff51);
        Bond::GetSourceAtom((Bond *)this_00._M_current);
        bVar2 = std::operator==((shared_ptr<indigox::Atom> *)__a._M_current,
                                (shared_ptr<indigox::Atom> *)
                                CONCAT17(in_stack_fffffffffffffedf,
                                         CONCAT16(in_stack_fffffffffffffede,
                                                  CONCAT15(in_stack_fffffffffffffedd,
                                                           CONCAT14(in_stack_fffffffffffffedc,
                                                                    in_stack_fffffffffffffed8)))));
        in_stack_fffffffffffffedf = 0;
        bVar3 = in_stack_fffffffffffffedf;
        if (bVar2) {
          std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )0x10ff96);
          Bond::GetTargetAtom((Bond *)this_00._M_current);
          bVar3 = std::operator==((shared_ptr<indigox::Atom> *)__a._M_current,
                                  (shared_ptr<indigox::Atom> *)
                                  CONCAT17(in_stack_fffffffffffffedf,
                                           CONCAT16(in_stack_fffffffffffffede,
                                                    CONCAT15(in_stack_fffffffffffffedd,
                                                             CONCAT14(in_stack_fffffffffffffedc,
                                                                      in_stack_fffffffffffffed8)))))
          ;
          in_stack_fffffffffffffedf = bVar3;
          std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x10ffe7);
        }
        in_stack_fffffffffffffede = bVar3;
        std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x10fff4);
        if ((in_stack_fffffffffffffede & 1) == 0) {
          std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )0x11005f);
          Bond::GetSourceAtom((Bond *)this_00._M_current);
          bVar2 = std::operator==((shared_ptr<indigox::Atom> *)__a._M_current,
                                  (shared_ptr<indigox::Atom> *)
                                  CONCAT17(in_stack_fffffffffffffedf,
                                           CONCAT16(in_stack_fffffffffffffede,
                                                    CONCAT15(in_stack_fffffffffffffedd,
                                                             CONCAT14(in_stack_fffffffffffffedc,
                                                                      in_stack_fffffffffffffed8)))))
          ;
          in_stack_fffffffffffffedd = 0;
          bVar3 = in_stack_fffffffffffffedd;
          if (bVar2) {
            std::__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<indigox::Bond,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x11009b);
            Bond::GetTargetAtom((Bond *)this_00._M_current);
            bVar3 = std::operator==((shared_ptr<indigox::Atom> *)__a._M_current,
                                    (shared_ptr<indigox::Atom> *)
                                    CONCAT17(in_stack_fffffffffffffedf,
                                             CONCAT16(in_stack_fffffffffffffede,
                                                      CONCAT15(in_stack_fffffffffffffedd,
                                                               CONCAT14(in_stack_fffffffffffffedc,
                                                                        in_stack_fffffffffffffed8)))
                                            ));
            in_stack_fffffffffffffedd = bVar3;
            std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x1100dd);
          }
          in_stack_fffffffffffffedc = bVar3;
          std::shared_ptr<indigox::Atom>::~shared_ptr((shared_ptr<indigox::Atom> *)0x1100e7);
          if ((in_stack_fffffffffffffedc & 1) == 0) {
            local_50 = 0;
          }
          else {
            bVar1 = true;
            local_50 = 1;
          }
        }
        else {
          bVar1 = true;
          local_50 = 1;
        }
        if (!bVar1) {
          std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x110145);
        }
        if (local_50 != 0) goto LAB_0011018f;
        __gnu_cxx::
        __normal_iterator<std::weak_ptr<indigox::Bond>_*,_std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>_>
        ::operator++(local_68);
      }
      std::shared_ptr<indigox::Bond>::shared_ptr
                ((shared_ptr<indigox::Bond> *)__a._M_current,
                 (shared_ptr<indigox::Bond> *)
                 CONCAT17(in_stack_fffffffffffffedf,
                          CONCAT16(in_stack_fffffffffffffede,
                                   CONCAT15(in_stack_fffffffffffffedd,
                                            CONCAT14(in_stack_fffffffffffffedc,
                                                     in_stack_fffffffffffffed8)))));
      local_50 = 1;
    }
    else {
      std::shared_ptr<indigox::Bond>::shared_ptr
                (in_stack_fffffffffffffee0,
                 (shared_ptr<indigox::Bond> *)
                 CONCAT17(in_stack_fffffffffffffedf,
                          CONCAT16(in_stack_fffffffffffffede,
                                   CONCAT15(in_stack_fffffffffffffedd,
                                            CONCAT14(in_stack_fffffffffffffedc,
                                                     in_stack_fffffffffffffed8)))));
      local_50 = 1;
    }
  }
  else {
    std::shared_ptr<indigox::Bond>::shared_ptr
              (in_stack_fffffffffffffee0,
               (shared_ptr<indigox::Bond> *)
               CONCAT17(in_stack_fffffffffffffedf,
                        CONCAT16(in_stack_fffffffffffffede,
                                 CONCAT15(in_stack_fffffffffffffedd,
                                          CONCAT14(in_stack_fffffffffffffedc,
                                                   in_stack_fffffffffffffed8)))));
    local_50 = 1;
  }
LAB_0011018f:
  std::shared_ptr<indigox::Bond>::~shared_ptr((shared_ptr<indigox::Bond> *)0x11019c);
  BVar7.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  BVar7.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Bond_p)BVar7.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Bond_p Molecule::GetBond(Atom_p a, Atom_p b) const {
  /// @todo Logging system calls for fail reasons
  Bond_p bnd = Bond_p();
  if (a->GetMolecule()->GetUniqueID() != GetUniqueID()) return bnd;
  if (b->GetMolecule()->GetUniqueID() != GetUniqueID()) return bnd;
  for (AtomBondIterator it = a->BeginBond(); it != a->EndBond(); ++it) {
    Bond_p tmp = it->lock();
    if (tmp->GetSourceAtom() == a && tmp->GetTargetAtom() == b) return tmp;
    if (tmp->GetSourceAtom() == b && tmp->GetTargetAtom() == a) return tmp;
  }
  return bnd;
}